

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divceil.hpp
# Opt level: O0

enable_if_t<std::is_signed<short>::value_&&_(std::is_signed<short>::value____(std::is_unsigned<short>::value_&&_std::is_signed<std::common_type_t<short,_short>_>::value)),_short>
 burst::divceil<short,short>(Integer<short> n,Integer<short> divisor)

{
  enable_if_t<std::is_signed<short>::value_&&_(std::is_signed<short>::value____(std::is_unsigned<short>::value_&&_std::is_signed<std::common_type_t<short,_short>_>::value)),_short>
  eVar1;
  domain_error *this;
  Integer<short> divisor_local;
  Integer<short> n_local;
  
  if (0 < divisor) {
    eVar1 = detail::divceil_impl<short,short>(n,divisor);
    return eVar1;
  }
  this = (domain_error *)__cxa_allocate_exception(0x10);
  std::domain_error::domain_error(this,anon_var_dwarf_1eced);
  __cxa_throw(this,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

constexpr auto divceil (Integer<I> n, Integer<J> divisor)
    {
        if (divisor > 0)
        {
            return detail::divceil_impl(n, divisor);
        }
        else
        {
            throw std::domain_error("Целая часть от деления на неположительное число не определена.");
        }
    }